

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Expression * __thiscall wasm::Builder::makeConstantExpression(Builder *this,Literal *value)

{
  Type type_00;
  bool bVar1;
  char cVar2;
  int32_t x;
  Const *pCVar3;
  Expression *pEVar4;
  HeapType heapType;
  RefFunc *pRVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long lVar8;
  Literal *pLVar9;
  Literal *pLVar10;
  char *__assertion;
  long lVar11;
  Name func;
  Expression EVar12;
  Literal local_b0;
  Literal local_98;
  undefined1 local_80 [8];
  value_type c;
  size_type *local_60;
  string string;
  Type type;
  
  type_00.id = (value->type).id;
  if (type_00.id - 2 < 5) {
    wasm::Literal::Literal(&local_b0,value);
    pCVar3 = makeConst(this,&local_b0);
    pLVar10 = &local_b0;
  }
  else {
    bVar1 = Literal::isNull(value);
    if (bVar1) {
      pEVar4 = (Expression *)makeRefNull(this,type_00);
      return pEVar4;
    }
    cVar2 = wasm::Type::isFunction();
    if (cVar2 != '\0') {
      func = Literal::getFunc(value);
      heapType.id = wasm::Type::getHeapType();
      pRVar5 = makeRefFunc(this,func,heapType);
      return (Expression *)pRVar5;
    }
    cVar2 = wasm::Type::isRef();
    if ((cVar2 != '\0') && (lVar6 = wasm::Type::getHeapType(), lVar6 == 4)) {
      x = Literal::geti31(value,true);
      pCVar3 = makeConst<int>(this,x);
      pEVar4 = (Expression *)MixedArena::allocSpace(&this->wasm->allocator,0x18,8);
      pEVar4->_id = I31NewId;
      (pEVar4->type).id = 0;
      *(Const **)(pEVar4 + 1) = pCVar3;
      wasm::I31New::finalize();
      return pEVar4;
    }
    cVar2 = wasm::Type::isString();
    if (cVar2 != '\0') {
      local_60 = &string._M_string_length;
      string._M_dataplus._M_p = (pointer)0x0;
      string._M_string_length._0_1_ = 0;
      wasm::Literal::getGCData();
      string.field_2._8_8_ = local_80;
      c.type.id = (uintptr_t)this;
      if (c.field_0.i64 != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   c.field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      lVar6 = (*(long *)(string.field_2._8_8_ + 0x30) - *(long *)(string.field_2._8_8_ + 0x28) >> 3)
              * -0x5555555555555555 + *(long *)(string.field_2._8_8_ + 8);
      if (lVar6 != 0) {
        pLVar10 = (Literal *)(string.field_2._8_8_ + 0x10);
        lVar8 = -0x18;
        lVar11 = 0;
        do {
          pLVar9 = (Literal *)(*(long *)(string.field_2._8_8_ + 0x28) + lVar8);
          if (lVar11 == 0) {
            pLVar9 = pLVar10;
          }
          wasm::Literal::Literal((Literal *)local_80,pLVar9);
          wasm::Literal::getInteger();
          std::__cxx11::string::push_back((char)&local_60);
          wasm::Literal::~Literal((Literal *)local_80);
          lVar11 = lVar11 + 1;
          lVar8 = lVar8 + 0x18;
        } while (lVar6 != lVar11);
      }
      EVar12 = (Expression)wasm::IString::interned(string._M_dataplus._M_p,local_60,0);
      pEVar4 = (Expression *)
               MixedArena::allocSpace((MixedArena *)(*(long *)c.type.id + 0x158),0x20,8);
      pEVar4->_id = StringConstId;
      (pEVar4->type).id = 0;
      *(undefined8 *)(pEVar4 + 1) = 0;
      pEVar4[1] = EVar12;
      wasm::StringConst::finalize();
      if (local_60 == &string._M_string_length) {
        return pEVar4;
      }
      operator_delete(local_60,CONCAT71(string._M_string_length._1_7_,
                                        (undefined1)string._M_string_length) + 1);
      return pEVar4;
    }
    cVar2 = wasm::Type::isRef();
    if ((cVar2 == '\0') || (lVar6 = wasm::Type::getHeapType(), lVar6 != 0)) {
      cVar2 = wasm::Type::isTuple();
      if (cVar2 == '\0') {
        if (type_00.id < 7) {
          wasm::handle_unreachable
                    ("unsupported constant expression",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                     ,0x4a7);
        }
        __assertion = "type.isBasic() && \"TODO: handle compound types\"";
      }
      else {
        __assertion = "!type.isTuple() && \"Unexpected tuple type\"";
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                    ,0x4a6,"Expression *wasm::Builder::makeConstantExpression(Literal)");
    }
    wasm::Literal::internalize();
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)makeConstantExpression(this,&local_98);
    pCVar3 = (Const *)MixedArena::allocSpace(&this->wasm->allocator,0x20,8);
    (pCVar3->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id = RefAsId;
    (pCVar3->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id = 0;
    (pCVar3->value).field_0.i32 = 2;
    (pCVar3->value).field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var7;
    wasm::RefAs::finalize();
    pLVar10 = &local_98;
  }
  wasm::Literal::~Literal(pLVar10);
  return (Expression *)pCVar3;
}

Assistant:

Expression* makeConstantExpression(Literal value) {
    auto type = value.type;
    if (type.isNumber()) {
      return makeConst(value);
    }
    if (value.isNull()) {
      return makeRefNull(type);
    }
    if (type.isFunction()) {
      return makeRefFunc(value.getFunc(), type.getHeapType());
    }
    if (type.isRef() && type.getHeapType() == HeapType::i31) {
      return makeI31New(makeConst(value.geti31()));
    }
    if (type.isString()) {
      // TODO: more than ascii support
      std::string string;
      for (auto c : value.getGCData()->values) {
        string.push_back(c.getInteger());
      }
      return makeStringConst(string);
    }
    if (type.isRef() && type.getHeapType() == HeapType::ext) {
      return makeRefAs(ExternExternalize,
                       makeConstantExpression(value.internalize()));
    }
    TODO_SINGLE_COMPOUND(type);
    WASM_UNREACHABLE("unsupported constant expression");
  }